

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
jsoncons::decode_traits<std::vector<unsigned_long,std::allocator<unsigned_long>>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          decode_traits<std::vector<unsigned_long,std::allocator<unsigned_long>>,char,void> *this,
          basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *param_2,error_code *ec)

{
  char *pcVar1;
  long lVar2;
  typed_array_visitor<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> visitor;
  undefined **local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  undefined4 local_20;
  
  (**(code **)(*(long *)this + 0x10))(this,param_2);
  if (*(int *)&(param_2->super_basic_json_visitor<char>)._vptr_basic_json_visitor == 0) {
    pcVar1 = (char *)(**(code **)(*(long *)this + 0x20))(this);
    if (*pcVar1 == '\x0e') {
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar2 = (**(code **)(*(long *)this + 0x20))(this);
      if (*(long *)(lVar2 + 0x18) != 0) {
        lVar2 = (**(code **)(*(long *)this + 0x20))(this);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                  (__return_storage_ptr__,*(size_type *)(lVar2 + 0x18));
      }
      local_30 = &PTR__basic_json_visitor_00b5d998;
      local_20 = 0;
      local_28 = __return_storage_ptr__;
      (**(code **)(*(long *)this + 0x30))(this,&local_30,param_2);
      return __return_storage_ptr__;
    }
    std::error_code::operator=((error_code *)param_2,not_vector);
  }
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>&, 
            std::error_code& ec)
        {
            cursor.array_expected(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return T{};
            }
            switch (cursor.current().event_type())
            {
                case staj_event_type::begin_array:
                {
                    T v;
                    if (cursor.current().size() > 0)
                    {
                        reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v, cursor.current().size());
                    }
                    typed_array_visitor<T> visitor(v);
                    cursor.read_to(visitor, ec);
                    return v;
                }
                default:
                {
                    ec = conv_errc::not_vector;
                    return T{};
                }
            }
        }